

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

float S_GetRolloff(FRolloffInfo *rolloff,float distance,bool logarithmic)

{
  float fVar1;
  double dVar2;
  float local_24;
  float volume;
  bool logarithmic_local;
  float distance_local;
  FRolloffInfo *rolloff_local;
  
  if (rolloff == (FRolloffInfo *)0x0) {
    rolloff_local._4_4_ = 0.0;
  }
  else if (rolloff->MinDistance < distance) {
    if (rolloff->RolloffType == 2) {
      rolloff_local._4_4_ =
           rolloff->MinDistance /
           (rolloff->MinDistance +
           (rolloff->field_2).MaxDistance * (distance - rolloff->MinDistance));
    }
    else if (distance < (rolloff->field_2).MaxDistance) {
      local_24 = ((rolloff->field_2).MaxDistance - distance) /
                 ((rolloff->field_2).MaxDistance - rolloff->MinDistance);
      if ((rolloff->RolloffType == 3) && (S_SoundCurve != (BYTE *)0x0)) {
        local_24 = (float)S_SoundCurve[(int)((float)S_SoundCurveSize * (1.0 - local_24))] / 127.0;
      }
      if (logarithmic) {
        if (rolloff->RolloffType == 1) {
          rolloff_local._4_4_ = local_24;
        }
        else {
          fVar1 = powf(10.0,local_24);
          rolloff_local._4_4_ = (fVar1 - 1.0) / 9.0;
        }
      }
      else if (rolloff->RolloffType == 1) {
        dVar2 = log10((double)local_24 * 9.0 + 1.0);
        rolloff_local._4_4_ = (float)dVar2;
      }
      else {
        rolloff_local._4_4_ = local_24;
      }
    }
    else {
      rolloff_local._4_4_ = 0.0;
    }
  }
  else {
    rolloff_local._4_4_ = 1.0;
  }
  return rolloff_local._4_4_;
}

Assistant:

float S_GetRolloff(FRolloffInfo *rolloff, float distance, bool logarithmic)
{
	if (rolloff == NULL)
	{
		return 0;
	}

	if (distance <= rolloff->MinDistance)
	{
		return 1;
	}
	if (rolloff->RolloffType == ROLLOFF_Log)
	{ // Logarithmic rolloff has no max distance where it goes silent.
		return rolloff->MinDistance / (rolloff->MinDistance + rolloff->RolloffFactor * (distance - rolloff->MinDistance));
	}
	if (distance >= rolloff->MaxDistance)
	{
		return 0;
	}

	float volume = (rolloff->MaxDistance - distance) / (rolloff->MaxDistance - rolloff->MinDistance);
	if (rolloff->RolloffType == ROLLOFF_Custom && S_SoundCurve != NULL)
	{
		volume = S_SoundCurve[int(S_SoundCurveSize * (1 - volume))] / 127.f;
	}
	if (logarithmic)
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return volume;
		}
		else
		{
			return float((powf(10.f, volume) - 1.) / 9.);
		}
	}
	else
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return float(log10(9. * volume + 1.));
		}
		else
		{
			return volume;
		}
	}
}